

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall webrtc::Config::~Config(Config *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->options_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<webrtc::ConfigOptionID,_std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>,_std::_Select1st<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
  ::~_Rb_tree((_Rb_tree<webrtc::ConfigOptionID,_std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>,_std::_Select1st<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
               *)this);
  return;
}

Assistant:

~Config() {
    // Note: this method is inline so webrtc public API depends only
    // on the headers.
    for (OptionMap::iterator it = options_.begin();
         it != options_.end(); ++it) {
      delete it->second;
    }
  }